

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bool peparse::readWord(bounded_buffer *b,uint32_t offset,uint16_t *out)

{
  uint16_t uVar1;
  uint16_t *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint16_t tmp;
  _func_ios_base_ptr_ios_base_ptr *in_stack_000000e0;
  uint in_stack_000000ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined6 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4e;
  string local_b0 [32];
  string local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  uint16_t *local_20;
  bool local_1;
  
  if (in_RDI == (long *)0x0) {
    err = 10;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    __rhs = &local_60;
    to_string<unsigned_int>(in_stack_000000ec,in_stack_000000e0);
    std::operator+((char *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48),__rhs);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string((string *)&local_60);
    local_1 = false;
  }
  else if ((ulong)in_ESI + 1 < (ulong)*(uint *)(in_RDI + 1)) {
    if ((*(byte *)((long)in_RDI + 0xd) & 1) == 0) {
      *in_RDX = *(uint16_t *)(*in_RDI + (ulong)in_ESI);
    }
    else {
      local_20 = in_RDX;
      uVar1 = anon_unknown.dwarf_11b0::byteSwapUint16(*(uint16_t *)(*in_RDI + (ulong)in_ESI));
      *local_20 = uVar1;
    }
    local_1 = true;
  }
  else {
    err = 0xb;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(in_stack_000000ec,in_stack_000000e0);
    std::operator+((char *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff40);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool readWord(bounded_buffer *b, std::uint32_t offset, std::uint16_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 1 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  std::uint16_t tmp;
  memcpy(&tmp, (b->buf + offset), sizeof(std::uint16_t));
  if (b->swapBytes) {
    out = byteSwapUint16(tmp);
  } else {
    out = tmp;
  }

  return true;
}